

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O1

Vec_Int_t * If_ManCollectMappingInt(If_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint Entry;
  
  If_ManMarkMapping(p);
  iVar1 = p->vObjs->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar4;
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      puVar3 = (uint *)pVVar5->pArray[lVar8];
      if (((*puVar3 & 0xf) == 4) && (puVar3[3] != 0)) {
        uVar2 = puVar3[0x1b];
        Entry = uVar2 >> 0x18;
        Vec_IntPush(p_00,Entry);
        if (0xffffff < uVar2) {
          uVar7 = 0;
          do {
            Vec_IntPush(p_00,puVar3[uVar7 + 0x1c]);
            uVar7 = uVar7 + 1;
          } while (Entry != uVar7);
        }
        Vec_IntPush(p_00,puVar3[1]);
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * If_ManCollectMappingInt( If_Man_t * p )
{
    Vec_Int_t * vOrder;
    If_Cut_t * pCutBest;
    If_Obj_t * pObj;
    int i, k, nLeaves, * ppLeaves;
    If_ManMarkMapping( p );
    vOrder = Vec_IntAlloc( If_ManObjNum(p) );
    If_ManForEachObj( p, pObj, i )
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            pCutBest = If_ObjCutBest( pObj );
            nLeaves  = If_CutLeaveNum( pCutBest ); 
            ppLeaves = If_CutLeaves( pCutBest );
            // save the number of leaves, the leaves, and finally, the root
            Vec_IntPush( vOrder, nLeaves );
            for ( k = 0; k < nLeaves; k++ )
                Vec_IntPush( vOrder, ppLeaves[k] );
            Vec_IntPush( vOrder, pObj->Id );
        }
    return vOrder;
}